

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectileMotion.cpp
# Opt level: O3

double calculateGravity(vector<BoxPoint,_std::allocator<BoxPoint>_> *points)

{
  ulong uVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pBVar5;
  double *pdVar6;
  undefined8 uVar7;
  pointer pBVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  vector<double,_std::allocator<double>_> gravities;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  double local_30;
  
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_58,
             ((long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 5) - 2);
  pBVar5 = (points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar8 = (points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pBVar8 - (long)pBVar5 != 0x40) {
    uVar9 = (long)pBVar8 - (long)pBVar5 >> 5;
    lVar11 = 0x58;
    uVar10 = 0;
    do {
      if (uVar9 <= uVar10) goto LAB_00105cbc;
      uVar1 = uVar10 + 1;
      if (uVar9 <= uVar1) {
LAB_00105cab:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10 + 1);
LAB_00105cbc:
        uVar7 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar7);
      }
      uVar10 = uVar10 + 2;
      if (uVar9 <= uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00105cab;
      }
      dVar2 = *(double *)((long)&pBVar5[-1].x + lVar11);
      local_30 = (*(double *)((long)&pBVar5->x + lVar11) - dVar2) -
                 (dVar2 - *(double *)((long)&pBVar5[-2].x + lVar11));
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_30);
        pBVar5 = (points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar8 = (points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_30;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = (long)pBVar8 - (long)pBVar5 >> 5;
      lVar11 = lVar11 + 0x20;
      uVar10 = uVar1;
    } while (uVar1 < uVar9 - 2);
  }
  pdVar4 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = 0.0;
  for (pdVar6 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    local_38 = local_38 + *pdVar6;
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar11 = (long)pdVar4 - (long)pdVar3 >> 3;
  auVar12._8_4_ = (int)((long)pdVar4 - (long)pdVar3 >> 0x23);
  auVar12._0_8_ = lVar11;
  auVar12._12_4_ = 0x45300000;
  return local_38 /
         ((auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
}

Assistant:

double calculateGravity(std::vector<BoxPoint> points){
    // estimates acceleration of gravityusing the trajectory of the given points
    std::vector<double> gravities;
    gravities.reserve(points.size() - 2);
    for(size_t i=0; i<points.size()-2; i++){
        BoxPoint cur = points.at(i);
        BoxPoint next = points.at(i+1);
        BoxPoint last = points.at(i+2);

        // find v2, v1, g = v2-v1/deltat, deltat=1
        double v1 = next.z - cur.z;
        double v2 = last.z - next.z;
        gravities.emplace_back(v2-v1);

    }
    return std::accumulate(gravities.begin(), gravities.end(), 0.0)/gravities.size();
}